

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

Var Js::JavascriptString::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var aValue;
  Var pvVar6;
  JavascriptSymbol *pJVar7;
  JavascriptString *pJVar8;
  JavascriptStringObject *value;
  RecyclableObject *constructor;
  RecyclableObject *obj;
  int in_stack_00000010;
  Arguments local_50;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x7d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bba149;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)auStack_40,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if ((auStack_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x80,"(args.Info.Count > 0)","Negative argument count");
    if (!bVar3) {
LAB_00bba149:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  aValue = Arguments::GetNewTarget((Arguments *)auStack_40);
  local_50.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_50);
  if ((auStack_40._0_4_ & 0xfffffe) == 0) {
    value = (JavascriptStringObject *)
            JavascriptLibrary::GetEmptyString((pSVar1->super_ScriptContextBase).javascriptLibrary);
  }
  else {
    pvVar6 = Arguments::operator[]((Arguments *)auStack_40,1);
    bVar4 = VarIs<Js::JavascriptSymbol>(pvVar6);
    if (((bVar4) &&
        (pJVar7 = UnsafeVarTo<Js::JavascriptSymbol>(pvVar6), pJVar7 != (JavascriptSymbol *)0x0)) &&
       (((ulong)args.super_Arguments.Values & 0x1000000) == 0)) {
      pJVar8 = JavascriptSymbol::ToString
                         ((pJVar7->propertyRecordUsageCache).propertyRecord.ptr,pSVar1);
      return pJVar8;
    }
    pvVar6 = Arguments::operator[]((Arguments *)auStack_40,1);
    value = (JavascriptStringObject *)JavascriptConversion::ToString(pvVar6,pSVar1);
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    value = JavascriptLibrary::CreateStringObject
                      ((pSVar1->super_ScriptContextBase).javascriptLibrary,(JavascriptString *)value
                      );
  }
  if (bVar3) {
    constructor = VarTo<Js::RecyclableObject>(aValue);
    obj = UnsafeVarTo<Js::RecyclableObject>(value);
    value = (JavascriptStringObject *)
            JavascriptOperators::OrdinaryCreateFromConstructor
                      (constructor,obj,(DynamicObject *)0x0,pSVar1);
  }
  return value;
}

Assistant:

Var JavascriptString::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Negative argument count");

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        Var newTarget = args.GetNewTarget();
        bool isCtorSuperCall = JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        JavascriptString* str;
        Var result;

        if (args.Info.Count > 1)
        {
            JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(args[1]);
            if (symbol && !(callInfo.Flags & CallFlags_New))
            {
                // By ES2015 21.1.1.1 step 2, calling the String constructor directly results in an explicit ToString, which does not throw.
                return JavascriptSymbol::ToString(symbol->GetValue(), scriptContext);
                // Calling with new is an implicit ToString on the Symbol, resulting in a throw. For this case we can let JavascriptConversion handle the call.
            }
            str = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            str = scriptContext->GetLibrary()->GetEmptyString();
        }

        if (callInfo.Flags & CallFlags_New)
        {
            result = scriptContext->GetLibrary()->CreateStringObject(str);
        }
        else
        {
            result = str;
        }

        return isCtorSuperCall ?
            JavascriptOperators::OrdinaryCreateFromConstructor(VarTo<RecyclableObject>(newTarget), UnsafeVarTo<RecyclableObject>(result), nullptr, scriptContext) :
            result;
    }